

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v_font.cpp
# Opt level: O1

FArchive * SerializeFFontPtr(FArchive *arc,FFont **font)

{
  FFont *pFVar1;
  char *name;
  char *local_20;
  
  if (arc->m_Storing == true) {
    FArchive::operator<<(arc,&(*font)->Name);
  }
  else {
    local_20 = (char *)0x0;
    FArchive::operator<<(arc,&local_20);
    pFVar1 = V_GetFont(local_20);
    *font = pFVar1;
    if (pFVar1 == (FFont *)0x0) {
      Printf("Could not load font %s\n",local_20);
      *font = SmallFont;
    }
    if (local_20 != (char *)0x0) {
      operator_delete__(local_20);
    }
  }
  return arc;
}

Assistant:

FArchive &SerializeFFontPtr (FArchive &arc, FFont* &font)
{
	if (arc.IsStoring ())
	{
		arc << font->Name;
	}
	else
	{
		char *name = NULL;

		arc << name;
		font = V_GetFont(name);
		if (font == NULL)
		{
			Printf ("Could not load font %s\n", name);
			font = SmallFont;
		}
		delete[] name;
	}
	return arc;
}